

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_mips16_save(DisasContext_conflict6 *ctx,int xsregs,int aregs,int do_ra,int do_s0,int do_s1,
                    int framesize)

{
  TCGContext_conflict6 *tcg_ctx;
  TCGv_i64 addr;
  TCGv_i64 t;
  TCGv_i64 ret;
  uintptr_t o;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  addr = tcg_temp_new_i64(tcg_ctx);
  t = tcg_temp_new_i64(tcg_ctx);
  ret = tcg_temp_new_i64(tcg_ctx);
  if (0xe < (uint)aregs) {
    generate_exception_end(ctx,0x14);
    return;
  }
  switch((ulong)(uint)aregs) {
  case 0xe:
    gen_base_offset_addr(ctx,addr,0x1d,0xc);
    gen_load_gpr(tcg_ctx,t,7);
    tcg_gen_qemu_st_i64_mips64el(tcg_ctx,t,addr,(long)ctx->mem_idx,MO_32);
  case 0xc:
  case 0xd:
    gen_base_offset_addr(ctx,addr,0x1d,8);
    gen_load_gpr(tcg_ctx,t,6);
    tcg_gen_qemu_st_i64_mips64el(tcg_ctx,t,addr,(long)ctx->mem_idx,MO_32);
  case 8:
  case 9:
  case 10:
    gen_base_offset_addr(ctx,addr,0x1d,4);
    gen_load_gpr(tcg_ctx,t,5);
    tcg_gen_qemu_st_i64_mips64el(tcg_ctx,t,addr,(long)ctx->mem_idx,MO_32);
  case 4:
  case 5:
  case 6:
  case 7:
    gen_base_offset_addr(ctx,addr,0x1d,0);
    gen_load_gpr(tcg_ctx,t,4);
    tcg_gen_qemu_st_i64_mips64el(tcg_ctx,t,addr,(long)ctx->mem_idx,MO_32);
  default:
    gen_load_gpr(tcg_ctx,addr,0x1d);
    if (do_ra != 0) {
      tcg_gen_movi_i64_mips64el(tcg_ctx,ret,-4);
      gen_op_addr_add(ctx,addr,addr,ret);
      gen_load_gpr(tcg_ctx,t,0x1f);
      tcg_gen_qemu_st_i64_mips64el(tcg_ctx,t,addr,(long)ctx->mem_idx,MO_32);
    }
  }
  switch(xsregs) {
  case 7:
    tcg_gen_movi_i64_mips64el(tcg_ctx,ret,-4);
    gen_op_addr_add(ctx,addr,addr,ret);
    gen_load_gpr(tcg_ctx,t,0x1e);
    tcg_gen_qemu_st_i64_mips64el(tcg_ctx,t,addr,(long)ctx->mem_idx,MO_32);
  case 6:
    tcg_gen_movi_i64_mips64el(tcg_ctx,ret,-4);
    gen_op_addr_add(ctx,addr,addr,ret);
    gen_load_gpr(tcg_ctx,t,0x17);
    tcg_gen_qemu_st_i64_mips64el(tcg_ctx,t,addr,(long)ctx->mem_idx,MO_32);
  case 5:
    tcg_gen_movi_i64_mips64el(tcg_ctx,ret,-4);
    gen_op_addr_add(ctx,addr,addr,ret);
    gen_load_gpr(tcg_ctx,t,0x16);
    tcg_gen_qemu_st_i64_mips64el(tcg_ctx,t,addr,(long)ctx->mem_idx,MO_32);
  case 4:
    tcg_gen_movi_i64_mips64el(tcg_ctx,ret,-4);
    gen_op_addr_add(ctx,addr,addr,ret);
    gen_load_gpr(tcg_ctx,t,0x15);
    tcg_gen_qemu_st_i64_mips64el(tcg_ctx,t,addr,(long)ctx->mem_idx,MO_32);
  case 3:
    tcg_gen_movi_i64_mips64el(tcg_ctx,ret,-4);
    gen_op_addr_add(ctx,addr,addr,ret);
    gen_load_gpr(tcg_ctx,t,0x14);
    tcg_gen_qemu_st_i64_mips64el(tcg_ctx,t,addr,(long)ctx->mem_idx,MO_32);
  case 2:
    tcg_gen_movi_i64_mips64el(tcg_ctx,ret,-4);
    gen_op_addr_add(ctx,addr,addr,ret);
    gen_load_gpr(tcg_ctx,t,0x13);
    tcg_gen_qemu_st_i64_mips64el(tcg_ctx,t,addr,(long)ctx->mem_idx,MO_32);
  case 1:
    tcg_gen_movi_i64_mips64el(tcg_ctx,ret,-4);
    gen_op_addr_add(ctx,addr,addr,ret);
    gen_load_gpr(tcg_ctx,t,0x12);
    tcg_gen_qemu_st_i64_mips64el(tcg_ctx,t,addr,(long)ctx->mem_idx,MO_32);
  default:
    if (do_s1 != 0) {
      tcg_gen_movi_i64_mips64el(tcg_ctx,ret,-4);
      gen_op_addr_add(ctx,addr,addr,ret);
      gen_load_gpr(tcg_ctx,t,0x11);
      tcg_gen_qemu_st_i64_mips64el(tcg_ctx,t,addr,(long)ctx->mem_idx,MO_32);
    }
    if (do_s0 != 0) {
      tcg_gen_movi_i64_mips64el(tcg_ctx,ret,-4);
      gen_op_addr_add(ctx,addr,addr,ret);
      gen_load_gpr(tcg_ctx,t,0x10);
      tcg_gen_qemu_st_i64_mips64el(tcg_ctx,t,addr,(long)ctx->mem_idx,MO_32);
    }
    (*(code *)(&DAT_00baddc8 + *(int *)(&DAT_00baddc8 + (ulong)(uint)aregs * 4)))();
    return;
  }
}

Assistant:

static void gen_mips16_save(DisasContext *ctx,
                            int xsregs, int aregs,
                            int do_ra, int do_s0, int do_s1,
                            int framesize)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0 = tcg_temp_new(tcg_ctx);
    TCGv t1 = tcg_temp_new(tcg_ctx);
    TCGv t2 = tcg_temp_new(tcg_ctx);
    int args, astatic;

    switch (aregs) {
    case 0:
    case 1:
    case 2:
    case 3:
    case 11:
        args = 0;
        break;
    case 4:
    case 5:
    case 6:
    case 7:
        args = 1;
        break;
    case 8:
    case 9:
    case 10:
        args = 2;
        break;
    case 12:
    case 13:
        args = 3;
        break;
    case 14:
        args = 4;
        break;
    default:
        generate_exception_end(ctx, EXCP_RI);
        return;
    }

    switch (args) {
    case 4:
        gen_base_offset_addr(ctx, t0, 29, 12);
        gen_load_gpr(tcg_ctx, t1, 7);
        tcg_gen_qemu_st_tl(tcg_ctx, t1, t0, ctx->mem_idx, MO_TEUL);
        /* Fall through */
    case 3:
        gen_base_offset_addr(ctx, t0, 29, 8);
        gen_load_gpr(tcg_ctx, t1, 6);
        tcg_gen_qemu_st_tl(tcg_ctx, t1, t0, ctx->mem_idx, MO_TEUL);
        /* Fall through */
    case 2:
        gen_base_offset_addr(ctx, t0, 29, 4);
        gen_load_gpr(tcg_ctx, t1, 5);
        tcg_gen_qemu_st_tl(tcg_ctx, t1, t0, ctx->mem_idx, MO_TEUL);
        /* Fall through */
    case 1:
        gen_base_offset_addr(ctx, t0, 29, 0);
        gen_load_gpr(tcg_ctx, t1, 4);
        tcg_gen_qemu_st_tl(tcg_ctx, t1, t0, ctx->mem_idx, MO_TEUL);
    }

    gen_load_gpr(tcg_ctx, t0, 29);

#define DECR_AND_STORE(reg) do {                                 \
        tcg_gen_movi_tl(tcg_ctx, t2, -4);                                 \
        gen_op_addr_add(ctx, t0, t0, t2);                        \
        gen_load_gpr(tcg_ctx, t1, reg);                                   \
        tcg_gen_qemu_st_tl(tcg_ctx, t1, t0, ctx->mem_idx, MO_TEUL); \
    } while (0)

    if (do_ra) {
        DECR_AND_STORE(31);
    }

    switch (xsregs) {
    case 7:
        DECR_AND_STORE(30);
        /* Fall through */
    case 6:
        DECR_AND_STORE(23);
        /* Fall through */
    case 5:
        DECR_AND_STORE(22);
        /* Fall through */
    case 4:
        DECR_AND_STORE(21);
        /* Fall through */
    case 3:
        DECR_AND_STORE(20);
        /* Fall through */
    case 2:
        DECR_AND_STORE(19);
        /* Fall through */
    case 1:
        DECR_AND_STORE(18);
    }

    if (do_s1) {
        DECR_AND_STORE(17);
    }
    if (do_s0) {
        DECR_AND_STORE(16);
    }

    switch (aregs) {
    case 0:
    case 4:
    case 8:
    case 12:
    case 14:
        astatic = 0;
        break;
    case 1:
    case 5:
    case 9:
    case 13:
        astatic = 1;
        break;
    case 2:
    case 6:
    case 10:
        astatic = 2;
        break;
    case 3:
    case 7:
        astatic = 3;
        break;
    case 11:
        astatic = 4;
        break;
    default:
        generate_exception_end(ctx, EXCP_RI);
        return;
    }

    if (astatic > 0) {
        DECR_AND_STORE(7);
        if (astatic > 1) {
            DECR_AND_STORE(6);
            if (astatic > 2) {
                DECR_AND_STORE(5);
                if (astatic > 3) {
                    DECR_AND_STORE(4);
                }
            }
        }
    }
#undef DECR_AND_STORE

    tcg_gen_movi_tl(tcg_ctx, t2, -framesize);
    gen_op_addr_add(ctx, tcg_ctx->cpu_gpr[29], tcg_ctx->cpu_gpr[29], t2);
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
    tcg_temp_free(tcg_ctx, t2);
}